

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint __thiscall
ON_SubDLevel::ClearComponentDamagedState
          (ON_SubDLevel *this,bool bClearVerticesDamagedState,bool bClearEdgesDamagedState,
          bool bClearFacesDamagedState)

{
  uint uVar1;
  bool bVar2;
  ON_SubDFace *local_38;
  ON_SubDFace *f;
  ON_SubDEdge *e;
  ON_SubDVertex *v;
  uint local_18;
  uint i;
  uint change_count;
  bool bClearFacesDamagedState_local;
  bool bClearEdgesDamagedState_local;
  bool bClearVerticesDamagedState_local;
  ON_SubDLevel *this_local;
  
  local_18 = 0;
  if (bClearVerticesDamagedState) {
    v._4_4_ = 0;
    e = (ON_SubDEdge *)this->m_vertex[0];
    while( true ) {
      bVar2 = false;
      if (e != (ON_SubDEdge *)0x0) {
        bVar2 = v._4_4_ < this->m_vertex_count;
        v._4_4_ = v._4_4_ + 1;
      }
      if (!bVar2) break;
      uVar1 = ON_ComponentStatus::SetDamagedState(&(e->super_ON_SubDComponentBase).m_status,false);
      if (uVar1 != 0) {
        local_18 = local_18 + 1;
      }
      e = e->m_next_edge;
    }
  }
  if (bClearEdgesDamagedState) {
    v._4_4_ = 0;
    f = (ON_SubDFace *)this->m_edge[0];
    while( true ) {
      bVar2 = false;
      if (f != (ON_SubDFace *)0x0) {
        bVar2 = v._4_4_ < this->m_edge_count;
        v._4_4_ = v._4_4_ + 1;
      }
      if (!bVar2) break;
      uVar1 = ON_ComponentStatus::SetDamagedState(&(f->super_ON_SubDComponentBase).m_status,false);
      if (uVar1 != 0) {
        local_18 = local_18 + 1;
      }
      f = f->m_next_face;
    }
  }
  if (bClearFacesDamagedState) {
    v._4_4_ = 0;
    local_38 = this->m_face[0];
    while( true ) {
      bVar2 = false;
      if (local_38 != (ON_SubDFace *)0x0) {
        bVar2 = v._4_4_ < this->m_face_count;
        v._4_4_ = v._4_4_ + 1;
      }
      if (!bVar2) break;
      uVar1 = ON_ComponentStatus::SetDamagedState
                        (&(local_38->super_ON_SubDComponentBase).m_status,false);
      if (uVar1 != 0) {
        local_18 = local_18 + 1;
      }
      local_38 = local_38->m_next_face;
    }
  }
  return local_18;
}

Assistant:

unsigned int ON_SubDLevel::ClearComponentDamagedState(
  bool bClearVerticesDamagedState,
  bool bClearEdgesDamagedState,
  bool bClearFacesDamagedState
) const
{
  unsigned int change_count = 0;
  unsigned int i;
  if (bClearVerticesDamagedState)
  {
    i = 0;
    for (const ON_SubDVertex* v = m_vertex[0]; nullptr != v && i++ < m_vertex_count; v = v->m_next_vertex)
      if (0 != v->m_status.SetDamagedState(false))
        ++change_count;
  }
  if (bClearEdgesDamagedState)
  {
    i = 0;
    for (const ON_SubDEdge* e = m_edge[0]; nullptr != e && i++ < m_edge_count; e = e->m_next_edge)
      if (0 != e->m_status.SetDamagedState(false))
        ++change_count;
  }
  if (bClearFacesDamagedState)
  {
    i = 0;
    for (const ON_SubDFace* f = m_face[0]; nullptr != f && i++ < m_face_count; f = f->m_next_face)
      if (0 != f->m_status.SetDamagedState(false))
        ++change_count;
  }
  return change_count;
}